

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

Type wasm::Type::getGreatestLowerBound(Type a,Type b)

{
  bool bVar1;
  BasicHeapType BVar2;
  BasicHeapType BVar3;
  size_t sVar4;
  size_t sVar5;
  Type *pTVar6;
  bool local_11a;
  bool local_119;
  HeapType local_e0;
  HeapType local_d8;
  uintptr_t local_d0;
  uintptr_t local_c8;
  uintptr_t local_c0;
  uintptr_t local_b8;
  HeapType local_b0;
  HeapType heapType;
  Exactness exactness;
  Nullability nullability;
  HeapType heapB;
  HeapType heapA;
  BasicType local_74;
  uintptr_t local_70;
  Type local_68;
  Type local_60;
  Type glb;
  size_t i;
  size_t size;
  vector<wasm::Type,_std::allocator<wasm::Type>_> elems;
  Type b_local;
  Type a_local;
  
  elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)b.id;
  b_local = a;
  bVar1 = operator==(&b_local,(Type *)&elems.
                                       super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    a_local = b_local;
  }
  else {
    bVar1 = isTuple(&b_local);
    if ((bVar1) &&
       (bVar1 = isTuple((Type *)&elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)) {
      sVar4 = Type::size(&b_local);
      sVar5 = Type::size((Type *)&elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar4 == sVar5) {
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&size);
        sVar4 = Type::size(&b_local);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&size,sVar4);
        glb.id = 0;
        do {
          if (sVar4 <= glb.id) {
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&heapA,
                       (vector<wasm::Type,_std::allocator<wasm::Type>_> *)&size);
            Type(&a_local,(Tuple *)&heapA);
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&heapA);
LAB_026741d1:
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&size);
            return (Type)a_local.id;
          }
          pTVar6 = operator[](&b_local,glb.id);
          local_68.id = pTVar6->id;
          pTVar6 = operator[]((Type *)&elems.
                                       super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage,glb.id);
          local_70 = pTVar6->id;
          local_60 = getGreatestLowerBound(local_68,local_70);
          local_74 = unreachable;
          bVar1 = operator==(&local_60,&local_74);
          if (bVar1) {
            Type(&a_local,unreachable);
            goto LAB_026741d1;
          }
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&size,&local_60);
          glb.id = glb.id + 1;
        } while( true );
      }
    }
    bVar1 = isRef(&b_local);
    if ((bVar1) &&
       (bVar1 = isRef((Type *)&elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)) {
      heapB = getHeapType(&b_local);
      _exactness = getHeapType((Type *)&elems.
                                        super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
      BVar2 = HeapType::getBottom(&heapB);
      BVar3 = HeapType::getBottom((HeapType *)&exactness);
      if (BVar2 == BVar3) {
        bVar1 = isNonNullable(&b_local);
        local_119 = true;
        if (!bVar1) {
          local_119 = isNonNullable((Type *)&elems.
                                             super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        heapType.id._4_4_ = (Nullability)(local_119 == false);
        bVar1 = isExact(&b_local);
        local_11a = true;
        if (!bVar1) {
          local_11a = isExact((Type *)&elems.
                                       super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        heapType.id._0_4_ = (Exactness)(local_11a != false);
        HeapType::HeapType(&local_b0);
        local_b8 = heapB.id;
        local_c0 = _exactness;
        bVar1 = HeapType::isSubType(heapB,_exactness);
        if (bVar1) {
          local_b0.id = heapB.id;
        }
        else {
          local_c8 = _exactness;
          local_d0 = heapB.id;
          bVar1 = HeapType::isSubType(_exactness,heapB);
          if (bVar1) {
            local_b0.id = _exactness;
          }
          else {
            BVar2 = HeapType::getBottom(&heapB);
            HeapType::HeapType(&local_d8,BVar2);
            local_b0.id = local_d8.id;
          }
        }
        bVar1 = isExact(&b_local);
        if (((bVar1) && (bVar1 = HeapType::operator!=(&local_b0,&heapB), bVar1)) ||
           ((bVar1 = isExact((Type *)&elems.
                                      super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage), bVar1 &&
            (bVar1 = HeapType::operator!=(&local_b0,(HeapType *)&exactness), bVar1)))) {
          BVar2 = HeapType::getBottom(&heapB);
          HeapType::HeapType(&local_e0,BVar2);
          local_b0.id = local_e0.id;
          heapType.id._0_4_ = Inexact;
        }
        Type(&a_local,local_b0,heapType.id._4_4_,(Exactness)heapType.id);
      }
      else {
        Type(&a_local,unreachable);
      }
    }
    else {
      Type(&a_local,unreachable);
    }
  }
  return (Type)a_local.id;
}

Assistant:

Type Type::getGreatestLowerBound(Type a, Type b) {
  if (a == b) {
    return a;
  }
  if (a.isTuple() && b.isTuple() && a.size() == b.size()) {
    std::vector<Type> elems;
    size_t size = a.size();
    elems.reserve(size);
    for (size_t i = 0; i < size; ++i) {
      auto glb = Type::getGreatestLowerBound(a[i], b[i]);
      if (glb == Type::unreachable) {
        return Type::unreachable;
      }
      elems.push_back(glb);
    }
    return Tuple(elems);
  }
  if (!a.isRef() || !b.isRef()) {
    return Type::unreachable;
  }
  auto heapA = a.getHeapType();
  auto heapB = b.getHeapType();
  if (heapA.getBottom() != heapB.getBottom()) {
    return Type::unreachable;
  }
  auto nullability =
    (a.isNonNullable() || b.isNonNullable()) ? NonNullable : Nullable;
  auto exactness = (a.isExact() || b.isExact()) ? Exact : Inexact;
  HeapType heapType;
  if (HeapType::isSubType(heapA, heapB)) {
    heapType = heapA;
  } else if (HeapType::isSubType(heapB, heapA)) {
    heapType = heapB;
  } else {
    heapType = heapA.getBottom();
  }
  // If one of the types is exact, but the GLB heap type is different than its
  // heap type, then we must make the GLB heap type bottom.
  if ((a.isExact() && heapType != heapA) ||
      (b.isExact() && heapType != heapB)) {
    heapType = heapA.getBottom();
    exactness = Inexact;
  }
  return Type(heapType, nullability, exactness);
}